

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryLeakDetector.cpp
# Opt level: O0

char * __thiscall
MemoryLeakDetector::reallocMemory
          (MemoryLeakDetector *this,TestMemoryAllocator *allocator,char *memory,size_t size,
          char *file,size_t line,bool allocatNodesSeperately)

{
  MemoryLeakDetectorNode *pMVar1;
  char *pcVar2;
  char *in_RCX;
  char *in_RDX;
  MemoryLeakOutputStringBuffer *in_RSI;
  TestMemoryAllocator *in_RDI;
  TestMemoryAllocator *in_R8;
  MemoryLeakFailure *in_R9;
  TestMemoryAllocator *unaff_retaddr;
  undefined1 in_stack_00000008;
  undefined7 in_stack_00000009;
  MemoryLeakDetectorNode *node;
  undefined7 in_stack_00000018;
  undefined4 in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffac;
  MemoryLeakDetector *in_stack_fffffffffffffff8;
  
  if (in_RDX != (char *)0x0) {
    pMVar1 = MemoryLeakDetectorTable::removeNode
                       ((MemoryLeakDetectorTable *)in_RDI,
                        (char *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
    if (pMVar1 == (MemoryLeakDetectorNode *)0x0) {
      MemoryLeakOutputStringBuffer::reportDeallocateNonAllocatedMemoryFailure
                (in_RSI,in_RDX,(size_t)in_RCX,in_R8,in_R9);
      return (char *)0x0;
    }
    checkForCorruption((MemoryLeakDetector *)line,
                       (MemoryLeakDetectorNode *)CONCAT17(allocatNodesSeperately,in_stack_00000018),
                       (char *)node,CONCAT71(in_stack_00000009,in_stack_00000008),unaff_retaddr,
                       SUB81((ulong)in_stack_fffffffffffffff8 >> 0x38,0));
  }
  pcVar2 = reallocateMemoryAndLeakInformation
                     (in_stack_fffffffffffffff8,in_RDI,(char *)in_RSI,(size_t)in_RDX,in_RCX,
                      (size_t)in_R8,SUB81((ulong)in_R9 >> 0x38,0));
  return pcVar2;
}

Assistant:

char* MemoryLeakDetector::reallocMemory(TestMemoryAllocator* allocator, char* memory, size_t size, const char* file, size_t line, bool allocatNodesSeperately)
{
#ifdef CPPUTEST_DISABLE_MEM_CORRUPTION_CHECK
   allocatNodesSeperately = true;
#endif
    if (memory) {
        MemoryLeakDetectorNode* node = memoryTable_.removeNode(memory);
        if (node == NULLPTR) {
            outputBuffer_.reportDeallocateNonAllocatedMemoryFailure(file, line, allocator, reporter_);
            return NULLPTR;
        }
        checkForCorruption(node, file, line, allocator, allocatNodesSeperately);
    }
    return reallocateMemoryAndLeakInformation(allocator, memory, size, file, line, allocatNodesSeperately);
}